

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emu2149.c
# Opt level: O2

UINT8 device_start_ay8910_emu(AY8910_CFG *cfg,DEV_INFO *retDevInf)

{
  byte bVar1;
  uint c;
  uint uVar2;
  UINT8 UVar3;
  EPSG *psg;
  uint32_t (*pauVar4) [32];
  uint r;
  byte flags;
  
  bVar1 = cfg->chipType;
  flags = cfg->chipFlags & 0xef;
  if (0xf < bVar1) {
    flags = cfg->chipFlags;
  }
  c = (cfg->_genCfg).clock;
  r = c >> (4U - ((flags & 0x10) == 0) & 0x1f);
  UVar3 = (cfg->_genCfg).srMode;
  if (UVar3 == '\x02') {
    uVar2 = (cfg->_genCfg).smplRate;
    if (r <= uVar2) {
      r = uVar2;
    }
  }
  else if (UVar3 == '\x01') {
    r = (cfg->_genCfg).smplRate;
  }
  psg = EPSG_new(c,r);
  if (psg == (EPSG *)0x0) {
    UVar3 = 0xff;
  }
  else {
    psg->quality = 0;
    internal_refresh(psg);
    pauVar4 = voltbl + 1;
    if (0xf < bVar1) {
      pauVar4 = voltbl;
    }
    psg->voltbl = *pauVar4;
    EPSG_setFlags(psg,flags);
    psg->_devData = (DEV_DATA)psg;
    retDevInf->dataPtr = &psg->_devData;
    retDevInf->sampleRate = r;
    retDevInf->devDef = &devDef_YM2149_Emu;
    retDevInf->linkDevCount = 0;
    retDevInf->linkDevs = (DEVLINK_INFO *)0x0;
    UVar3 = '\0';
  }
  return UVar3;
}

Assistant:

static UINT8 device_start_ay8910_emu(const AY8910_CFG* cfg, DEV_INFO* retDevInf)
{
	EPSG* chip;
	UINT8 isYM;
	UINT8 flags;
	UINT32 clock;
	UINT32 rate;
	
	clock = cfg->_genCfg.clock;
	isYM = ((cfg->chipType & 0xF0) > 0x00);
	flags = cfg->chipFlags;
	if (! isYM)
		flags &= ~YM2149_PIN26_LOW;
	
	if (flags & YM2149_PIN26_LOW)
		rate = clock / 2 / 8;
	else
		rate = clock / 8;
	SRATE_CUSTOM_HIGHEST(cfg->_genCfg.srMode, rate, cfg->_genCfg.smplRate);
	
	chip = EPSG_new(clock, rate);
	if (chip == NULL)
		return 0xFF;
	EPSG_set_quality(chip, 0);	// disable internal sample rate converter
	EPSG_setVolumeMode(chip, isYM ? 1 : 2);
	EPSG_setFlags(chip, flags);
	
	chip->_devData.chipInf = chip;
	INIT_DEVINF(retDevInf, &chip->_devData, rate, &devDef_YM2149_Emu);
	return 0x00;
}